

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TableImport::TableImport(TableImport *this,string_view name)

{
  TableImport *this_local;
  string_view name_local;
  
  ImportMixin<(wabt::ExternalKind)1>::ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)1>);
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import =
       (_func_int **)&PTR__TableImport_01e53458;
  Table::Table(&this->table,name);
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}